

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_TtPrintHexRev(FILE *pFile,word *pTruth,int nVars)

{
  uint uVar1;
  byte bVar2;
  int __c;
  word *pwVar3;
  int iVar4;
  
  for (pwVar3 = pTruth; pTruth <= pwVar3; pwVar3 = pwVar3 + -1) {
    bVar2 = 4;
    for (iVar4 = 1; -1 < iVar4; iVar4 = iVar4 + -1) {
      uVar1 = (uint)(*pwVar3 >> (bVar2 & 0x3f)) & 0xf;
      __c = uVar1 + 0x30;
      if (9 < uVar1) {
        __c = uVar1 + 0x37;
      }
      fputc(__c,(FILE *)pFile);
      bVar2 = bVar2 - 4;
    }
  }
  return;
}

Assistant:

static inline void Abc_TtPrintHexRev( FILE * pFile, word * pTruth, int nVars )
{
    word * pThis;
    int k, StartK = nVars >= 6 ? 16 : (1 << (nVars - 2));
    assert( nVars >= 2 );
    for ( pThis = pTruth + Abc_TtWordNum(nVars) - 1; pThis >= pTruth; pThis-- )
        for ( k = StartK - 1; k >= 0; k-- )
            fprintf( pFile, "%c", Abc_TtPrintDigit((int)(pThis[0] >> (k << 2)) & 15) );
//    printf( "\n" );
}